

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

float_t __thiscall djb::microfacet::g2(microfacet *this,vec3 *wm,vec3 *wi,vec3 *wo,args *args)

{
  float_t fVar1;
  float_t fVar2;
  float fVar3;
  
  fVar1 = 0.0;
  if (0.0 < wm->z) {
    fVar1 = 0.0;
    if ((0.0 < wi->z) && (0.0 < wo->z)) {
      fVar3 = wi->z * wo->z;
      fVar1 = sigma(this,wi,args);
      fVar2 = sigma(this,wo,args);
      fVar1 = fVar3 / ((fVar1 * wo->z + fVar2 * wi->z) - fVar3);
    }
  }
  return fVar1;
}

Assistant:

float_t
microfacet::g2(
	const vec3 &wm,
	const vec3 &wi,
	const vec3 &wo,
	const args &args
) const {
	if (wm.z > 0 && wi.z > 0 && wo.z > 0) {
		float_t zizo = wi.z * wo.z;
		float_t sigma_i = sigma(wi, args);
		float_t sigma_o = sigma(wo, args);
		return zizo / (sigma_i * wo.z + sigma_o * wi.z - zizo);
	}
	return 0;
}